

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O0

int sint1i_(int *n,double *wsave,int *lensav,int *ier)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 *in_RCX;
  int *in_RDX;
  long in_RSI;
  int *in_RDI;
  int *n_00;
  double dVar4;
  double dVar5;
  int *lensav_00;
  int lnsv;
  int ier1;
  int ns2;
  int np1;
  double pi;
  double dt;
  int k;
  int i__1;
  undefined4 in_stack_ffffffffffffff90;
  int iVar6;
  int local_4c;
  int local_30;
  
  *in_RCX = 0;
  iVar6 = *in_RDX;
  iVar2 = *in_RDI / 2 + *in_RDI;
  n_00 = (int *)log((double)*in_RDI);
  dVar4 = log(2.0);
  if (iVar6 < iVar2 + (int)((double)n_00 / dVar4) + 4) {
    *in_RCX = 2;
  }
  else {
    dVar4 = atan(1.0);
    if (1 < *in_RDI) {
      iVar1 = *in_RDI;
      iVar3 = *in_RDI + 1;
      for (local_30 = 1; local_30 <= iVar1 / 2; local_30 = local_30 + 1) {
        dVar5 = sin((double)local_30 * ((dVar4 * 4.0) / (double)iVar3));
        *(double *)(in_RSI + -8 + (long)local_30 * 8) = dVar5 * 2.0;
      }
      lensav_00 = (int *)log((double)iVar3);
      log(2.0);
      rfft1i_(n_00,(double *)CONCAT44(iVar6,iVar2),lensav_00,
              (int *)CONCAT44(iVar3,in_stack_ffffffffffffff90));
      if (local_4c != 0) {
        *in_RCX = 0x14;
      }
    }
  }
  return 0;
}

Assistant:

int sint1i_(int *n, fft_real_t *wsave, int *lensav,
	int *ier)
{
    /* System generated locals */
    int i__1;

    /* Builtin functions */

    /* Local variables */
     int k;
     fft_real_t dt, pi;
     int np1, ns2, ier1, lnsv;
    extern /* Subroutine */ int rfft1i_(int *, fft_real_t *, int *, int
	    *), xerfft_(char *, int *, ftnlen);


    /* Parameter adjustments */
    --wsave;

    /* Function Body */
    *ier = 0;

    if (*lensav < *n / 2 + *n + (int) (log((fft_real_t) (*n)) / log(2.0)) + 4) {
	*ier = 2;
	//xerfft_("SINT1I", &c__3, (ftnlen)6);
	goto L300;
    }

    pi = atan(1.0) * 4.0;
    if (*n <= 1) {
	return 0;
    }
    ns2 = *n / 2;
    np1 = *n + 1;
    dt = pi / (fft_real_t) np1;
    i__1 = ns2;
    for (k = 1; k <= i__1; ++k) {
	wsave[k] = sin(k * dt) * 2.0;
/* L101: */
    }
    lnsv = np1 + (int) (log((fft_real_t) np1) / log(2.0)) + 4;
    rfft1i_(&np1, &wsave[ns2 + 1], &lnsv, &ier1);
    if (ier1 != 0) {
	*ier = 20;
	//xerfft_("SINT1I", &c_n5, (ftnlen)6);
    }

L300:
    return 0;
}